

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O0

_Bool fxp_stat_recv(sftp_packet *pktin,sftp_request *req,fxp_attrs *attrs)

{
  fxp_attrs *attrs_local;
  sftp_request *req_local;
  sftp_packet *pktin_local;
  
  safefree(req);
  if (pktin->type == 0x69) {
    pktin_local._7_1_ = fxp_got_attrs(pktin,attrs);
  }
  else {
    fxp_got_status(pktin);
    sftp_pkt_free(pktin);
    pktin_local._7_1_ = false;
  }
  return pktin_local._7_1_;
}

Assistant:

bool fxp_stat_recv(struct sftp_packet *pktin, struct sftp_request *req,
                  struct fxp_attrs *attrs)
{
    sfree(req);
    if (pktin->type == SSH_FXP_ATTRS) {
        return fxp_got_attrs(pktin, attrs);
    } else {
        fxp_got_status(pktin);
        sftp_pkt_free(pktin);
        return false;
    }
}